

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  pointer pAVar1;
  reference pAVar2;
  __off64_t *in_R8;
  size_t in_R9;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *this_00;
  _List_const_iterator<argparse::Argument> local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _List_iterator<argparse::Argument> local_28;
  iterator tArgument;
  char *Fargs_local_1;
  char *Fargs_local;
  ArgumentParser *this_local;
  
  tArgument._M_node = (_List_node_base *)Fargs_1;
  Fargs_local_1 = Fargs;
  Fargs_local = (char *)this;
  local_30 = (_List_node_base *)
             std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                       (&this->mOptionalArguments);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
       emplace<char_const*,char_const*>
                 ((list<argparse::Argument,std::allocator<argparse::Argument>> *)
                  &this->mOptionalArguments,(const_iterator)local_30,&Fargs_local_1,
                  (char **)&tArgument);
  pAVar1 = std::_List_iterator<argparse::Argument>::operator->(&local_28);
  if ((pAVar1->field_0xbc & 1) == 0) {
    this_00 = &this->mPositionalArguments;
    local_38 = (_List_node_base *)
               std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                         (&this->mPositionalArguments);
    std::_List_const_iterator<argparse::Argument>::_List_const_iterator(&local_40,&local_28);
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (this_00,(int)local_38,(__off64_t *)&this->mOptionalArguments,(int)local_40._M_node,
               in_R8,in_R9,(uint)this_00);
  }
  index_argument(this,(list_iterator)local_28._M_node);
  pAVar2 = std::_List_iterator<argparse::Argument>::operator*(&local_28);
  return pAVar2;
}

Assistant:

Argument &add_argument(Targs... Fargs) {
    auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                std::move(Fargs)...);

    if (!tArgument->mIsOptional)
      mPositionalArguments.splice(cend(mPositionalArguments),
                                  mOptionalArguments, tArgument);

    index_argument(tArgument);
    return *tArgument;
  }